

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

void __thiscall
ON_Evaluator::ON_Evaluator
          (ON_Evaluator *this,int parameter_count,int value_count,ON_Interval *domain,bool *periodic
          )

{
  bool *pbVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  bool local_39;
  ON_SimpleArray<bool> *local_38;
  
  this->_vptr_ON_Evaluator = (_func_int **)&PTR__ON_Evaluator_00825a68;
  if (value_count < 1) {
    value_count = parameter_count;
  }
  this->m_parameter_count = parameter_count;
  this->m_value_count = value_count;
  (this->m_domain)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825aa8;
  (this->m_domain).m_a = (ON_Interval *)0x0;
  (this->m_domain).m_count = 0;
  (this->m_domain).m_capacity = 0;
  (this->m_bPeriodicParameter)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081bde8;
  (this->m_bPeriodicParameter).m_a = (bool *)0x0;
  (this->m_bPeriodicParameter).m_count = 0;
  (this->m_bPeriodicParameter).m_capacity = 0;
  if (domain != (ON_Interval *)0x0) {
    local_38 = &this->m_bPeriodicParameter;
    ON_SimpleArray<ON_Interval>::Reserve(&this->m_domain,(long)parameter_count);
    uVar2 = 0;
    uVar3 = uVar2;
    if (0 < parameter_count) {
      uVar2 = (ulong)(uint)parameter_count;
      uVar3 = uVar2;
    }
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      ON_SimpleArray<ON_Interval>::Append(&this->m_domain,domain);
      domain = domain + 1;
    }
    if (periodic != (bool *)0x0) {
      uVar2 = 0;
      do {
        if (uVar3 == uVar2) {
          return;
        }
        pbVar1 = periodic + uVar2;
        uVar2 = uVar2 + 1;
      } while (*pbVar1 != true);
      ON_SimpleArray<bool>::Reserve(local_38,(long)this->m_parameter_count);
      for (lVar4 = 0; lVar4 < this->m_parameter_count; lVar4 = lVar4 + 1) {
        local_39 = periodic[lVar4];
        ON_SimpleArray<bool>::Append(local_38,&local_39);
      }
    }
  }
  return;
}

Assistant:

ON_Evaluator::ON_Evaluator( 
                           int parameter_count,
                           int value_count,
                           const ON_Interval* domain,
                           const bool* periodic
                           )
             : m_parameter_count(parameter_count),
               m_value_count(value_count>0?value_count:parameter_count)
{
  int i;

  if (domain)
  {
    m_domain.Reserve(m_parameter_count);
    for ( i = 0; i < parameter_count; i++ )
      m_domain.Append(domain[i]);

    if (periodic )
    {
      for ( i = 0; i < parameter_count; i++ )
      {
        if  (periodic[i])
        {
          m_bPeriodicParameter.Reserve(m_parameter_count);
          for ( i = 0; i < m_parameter_count; i++ )
          {
            m_bPeriodicParameter.Append(periodic[i]?true:false);
          }
          break;
        }
      }
    }
  }
}